

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O0

bool anon_unknown.dwarf_17e46d::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int lx,int rx,int ly,int ry,int width)

{
  uint *puVar1;
  ostream *poVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  int in_R9D;
  int x;
  int y;
  int local_2c;
  int local_28;
  
  local_28 = in_ECX;
  do {
    local_2c = in_ESI;
    if (in_R8D < local_28) {
      return true;
    }
    for (; local_2c <= in_EDX; local_2c = local_2c + 1) {
      puVar1 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RDI,(long)local_28);
      if (puVar1[local_2c] != (local_28 * in_R9D + local_2c) % 0x801) {
        poVar2 = std::operator<<((ostream *)&std::cout,"value at ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
        poVar2 = std::operator<<(poVar2,": ");
        puVar1 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RDI,(long)local_28);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,puVar1[local_2c]);
        poVar2 = std::operator<<(poVar2,", should be ");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,(local_28 * in_R9D + local_2c) % 0x801);
        pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
        return false;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool checkPixels (Array2D<T> &ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T>(((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl << flush;
                return false;
            }
    return true;
}